

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int grapg_5_3::dijkstra_1(m_graph g,int v)

{
  code *pcVar1;
  undefined4 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  m_graph *local_68;
  long local_60;
  undefined4 *local_58;
  undefined4 *local_50;
  int local_48;
  int local_44;
  int j_1;
  int j;
  int i_1;
  int i;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_14;
  int local_10;
  int k;
  int min;
  int v_local;
  
  lVar3 = (long)&local_68 - ((ulong)(uint)g.vnum * 4 + 0xf & 0xfffffffffffffff0);
  puVar4 = (undefined4 *)(lVar3 - ((ulong)(uint)g.vnum * 4 + 0xf & 0xfffffffffffffff0));
  puVar2 = (undefined4 *)((long)puVar4 - ((ulong)(uint)g.vnum * 4 + 0xf & 0xfffffffffffffff0));
  for (j = 0; j < g.vnum; j = j + 1) {
    puVar4[j] = g.arc[v][j];
    puVar2[j] = 0;
    *(undefined4 *)(lVar3 + (long)j * 4) = 0;
  }
  local_68 = &g;
  local_60 = lVar3;
  local_58 = puVar4;
  local_50 = puVar2;
  _i_1 = (ulong)(uint)g.vnum;
  __vla_expr2 = (ulong)(uint)g.vnum;
  __vla_expr1 = (ulong)(uint)g.vnum;
  __vla_expr0 = (unsigned_long)&local_68;
  k = v;
  *puVar2 = 1;
  *puVar4 = 0;
  for (j_1 = 1; j_1 < local_68->vnum; j_1 = j_1 + 1) {
    local_10 = -1;
    for (local_44 = 0; local_44 < local_68->vnum; local_44 = local_44 + 1) {
      if ((local_50[local_44] == 0) && ((int)local_58[local_44] < local_10)) {
        local_10 = local_58[local_44];
        local_14 = local_44;
      }
    }
    local_50[local_14] = 1;
    for (local_48 = 0; local_48 < local_68->vnum; local_48 = local_48 + 1) {
      if ((local_50[local_48] == 0) &&
         (local_10 + local_68->arc[local_14][local_48] < (int)local_58[local_48])) {
        local_58[local_48] = local_10 + local_68->arc[local_14][local_48];
        *(int *)(local_60 + (long)local_48 * 4) = local_14;
      }
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int dijkstra_1(m_graph g, int v) {
        int min, k;
        int ver[g.vnum];
        int dis[g.vnum];
        int flag[g.vnum];
        for (int i = 0; i < g.vnum; i++) {
            dis[i] = g.arc[v][i];
            flag[i] = 0;
            ver[i] = 0;
        }
        flag[0] = 1;//自己一个点不用求
        dis[0] = 0;//自己到自己距离0
        for (int i = 1; i < g.vnum; i++) {
            min = INTMAX_MAX;
            for (int j = 0; j < g.vnum; j++) {
                if (flag[j] == 0 && dis[j] < min) {
                    min = dis[j];
                    k = j;
                }
            }
            flag[k] = 1;
            for (int j = 0; j < g.vnum; j++) {
                if (flag[j] == 0 && min + g.arc[k][j] < dis[j]) {
                    dis[j] = min + g.arc[k][j];
                    ver[j] = k;
                }
            }
        }
    }